

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>>::
findNode<QtGraphicsAnchorLayout::AnchorVertex*>
          (Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>_> *this,
          AnchorVertex **key)

{
  long lVar1;
  bool bVar2;
  Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *pNVar3;
  AnchorVertex **in_RDI;
  long in_FS_OFFSET;
  Bucket bucket;
  Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>_>
  *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<QtGraphicsAnchorLayout::AnchorVertex*>(in_stack_ffffffffffffffe0,in_RDI);
  bVar2 = Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>_>::Bucket
          ::isUnused((Bucket *)0x95cc9b);
  if (bVar2) {
    pNVar3 = (Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *)0x0;
  }
  else {
    pNVar3 = Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>_>::
             Bucket::node((Bucket *)0x95ccb6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar3;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }